

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(GenT genType)

{
  if (genType - MOC < 3) {
    return (string *)(&PTR_GenAUTOMOC_abi_cxx11__005e8c58)[genType - MOC];
  }
  return &GenAUTOGEN_abi_cxx11_;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorNameUpper(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return GenAUTOGEN;
    case GenT::MOC:
      return GenAUTOMOC;
    case GenT::UIC:
      return GenAUTOUIC;
    case GenT::RCC:
      return GenAUTORCC;
  }
  return GenAUTOGEN;
}